

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Optimisations.h
# Opt level: O2

void soul::Optimisations::recursivelyFlagModuleUse(Program *program,Module *m)

{
  pointer ppVar1;
  Module *in_RAX;
  Module *m_00;
  pointer ppVar2;
  pool_ptr<soul::Module> module;
  pool_ptr<soul::Module> local_28;
  
  m->moduleUseTestFlag = true;
  ppVar1 = (m->processorInstances).
           super__Vector_base<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_28.object = in_RAX;
  for (ppVar2 = (m->processorInstances).
                super__Vector_base<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar2 != ppVar1; ppVar2 = ppVar2 + 1) {
    Program::findModuleWithName((Program *)&local_28,(string *)program);
    if (local_28.object != (Module *)0x0) {
      m_00 = pool_ptr<soul::Module>::operator*(&local_28);
      recursivelyFlagModuleUse(program,m_00);
    }
  }
  return;
}

Assistant:

static void recursivelyFlagModuleUse (Program& program, Module& m)
    {
        m.moduleUseTestFlag = true;

        for (auto processorInstance : m.processorInstances)
            if (auto module = program.findModuleWithName (processorInstance->sourceName))
                recursivelyFlagModuleUse (program, *module);
    }